

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O1

string * __thiscall
AlignmentRecord::getReferenceSeq1_abi_cxx11_(string *__return_storage_ptr__,AlignmentRecord *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->reference_seq1)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (this->reference_seq1)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string AlignmentRecord::getReferenceSeq1() const{
    return this->reference_seq1;
}